

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

int64_t gguf_find_key(gguf_context *ctx,char *key)

{
  int iVar1;
  long lVar2;
  char *__s2;
  long key_id;
  
  lVar2 = ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x58;
  key_id = 0;
  if (lVar2 < 1) {
    lVar2 = key_id;
  }
  while( true ) {
    if (lVar2 == key_id) {
      return -1;
    }
    __s2 = gguf_get_key(ctx,key_id);
    iVar1 = strcmp(key,__s2);
    if (iVar1 == 0) break;
    key_id = key_id + 1;
  }
  return key_id;
}

Assistant:

int64_t gguf_find_key(const struct gguf_context * ctx, const char * key) {
    // return -1 if key not found
    int64_t keyfound = -1;

    const int64_t n_kv = gguf_get_n_kv(ctx);

    for (int64_t i = 0; i < n_kv; ++i) {
        if (strcmp(key, gguf_get_key(ctx, i)) == 0) {
            keyfound = i;
            break;
        }
    }

    return keyfound;
}